

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeysetTest.h
# Opt level: O2

bool PerlinNoise<unsigned_long>
               (hashfunc<unsigned_long> hash,int inputLen,bool testColl,bool testDist,
               bool drawDiagram)

{
  bool bVar1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> hashes;
  
  hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  PerlinNoiseTest<unsigned_long>(0xc,0xc,inputLen,1,hash.m_hash,&hashes);
  bVar1 = TestHashList<unsigned_long>(&hashes,drawDiagram,testColl,testDist,true,true);
  putchar(10);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&hashes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return bVar1;
}

Assistant:

bool PerlinNoise ( hashfunc<hashtype> hash, int inputLen,
                   bool testColl, bool testDist, bool drawDiagram )
{
  //----------

  std::vector<hashtype> hashes;

  PerlinNoiseTest(12, 12, inputLen, 1, hash,hashes);

  //----------

  bool result = true;

  result &= TestHashList(hashes,drawDiagram,testColl,testDist);

  printf("\n");

  return result;
}